

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall
TSMuxer::setSubMode(TSMuxer *this,AbstractMuxer *mainMuxer,bool flushInterleavedBlock)

{
  pointer this_00;
  TSMuxer *local_48;
  value_type_conflict3 local_2c;
  undefined1 local_28 [23];
  bool flushInterleavedBlock_local;
  AbstractMuxer *mainMuxer_local;
  TSMuxer *this_local;
  
  local_28[0xf] = flushInterleavedBlock;
  unique0x100000d9 = mainMuxer;
  mainMuxer_local = &this->super_AbstractMuxer;
  if (mainMuxer == (AbstractMuxer *)0x0) {
    local_48 = (TSMuxer *)0x0;
  }
  else {
    local_48 = (TSMuxer *)__dynamic_cast(mainMuxer,&AbstractMuxer::typeinfo,&typeinfo,0);
  }
  this->m_sublingMuxer = local_48;
  this->m_subMode = true;
  this->m_canSwithBlock = (bool)(local_28[0xf] & 1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::rbegin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_28);
  this_00 = std::
            reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                          *)local_28);
  local_2c = 0;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_2c);
  return;
}

Assistant:

void TSMuxer::setSubMode(AbstractMuxer* mainMuxer, const bool flushInterleavedBlock)
{
    m_sublingMuxer = dynamic_cast<TSMuxer*>(mainMuxer);
    m_subMode = true;
    m_canSwithBlock = flushInterleavedBlock;
    m_interleaveInfo.rbegin()->push_back(0);
}